

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void shuffle(vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  uint uVar4;
  pointer piVar5;
  ulong uVar6;
  
  srand(9);
  piVar5 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar5) >> 2 & 0xffffffff;
  for (; 1 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar4 = rand();
    uVar3 = (ulong)uVar4 % (uVar6 & 0xffffffff);
    piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar1 = piVar5[uVar6 - 1];
    piVar5[uVar6 - 1] = piVar2[uVar3];
    piVar2[uVar3] = iVar1;
    piVar5 = piVar2;
  }
  return;
}

Assistant:

static void shuffle(vector<int>* v) {
  srand(9);
  for (int n = v->size(); n >= 2; n--) {
    swap((*v)[n - 1], (*v)[static_cast<unsigned>(rand()) % n]);
  }
}